

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O0

bool __thiscall
helics::zeromq::ZmqCommsSS::processTxControlCmd
          (ZmqCommsSS *this,ActionMessage *cmd,
          map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *routes,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *connection_info)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  int32_t iVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RSI;
  CommsInterface *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *mc;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  bool close_tx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  route_id *in_stack_ffffffffffffff38;
  int iVar3;
  route_id in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff59 [15];
  _Self local_70;
  _Self local_68 [4];
  string_view local_48;
  string_view local_38;
  byte local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_21 = 0;
  iVar3 = *(int *)(in_RSI + 4);
  if (iVar3 == 0xe9) {
    local_18 = in_RDX;
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(in_stack_ffffffffffffff28);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_ffffffffffffff28);
    while (bVar1 = std::operator==(local_68,&local_70), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x4dbb9f);
      SmallBuffer::to_string((SmallBuffer *)0x4dbbb5);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      __x._1_15_ = in_stack_ffffffffffffff59;
      __x._M_len._0_1_ = in_stack_ffffffffffffff58;
      __y._M_len._4_4_ = in_stack_ffffffffffffff4c.rid;
      __y._M_len._0_4_ = iVar3;
      __y._M_str = in_stack_ffffffffffffff50;
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        iVar2 = ActionMessage::getExtraData((ActionMessage *)0x4dbc10);
        route_id::route_id((route_id *)&stack0xffffffffffffff64,iVar2);
        std::
        map<helics::route_id,std::__cxx11::string,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::__cxx11::string>>>
        ::emplace<helics::route_id,std::__cxx11::string_const&>
                  ((map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_RDI,in_stack_ffffffffffffff38,local_18);
        break;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffff30);
    }
  }
  else if (iVar3 == 0xf4) {
    iVar2 = ActionMessage::getExtraData((ActionMessage *)0x4dbc67);
    route_id::route_id((route_id *)&stack0xffffffffffffff4c,iVar2);
    std::
    map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase((map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_ffffffffffffff30,(key_type *)in_RDX);
  }
  else if (iVar3 == 299) {
    if ((in_RDI->serverMode & 1U) != 0) {
      local_38 = ActionMessage::name((ActionMessage *)0x4dbaf1);
      local_48 = SmallBuffer::to_string((SmallBuffer *)0x4dbb12);
      std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::
      emplace<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_RDI,in_RCX,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff30);
    }
  }
  else if (iVar3 == 0x7cd) {
    CommsInterface::setTxStatus(in_RDI,(ConnectionStatus)((ulong)in_stack_ffffffffffffff38 >> 0x20))
    ;
  }
  else if ((iVar3 == 0x9db) || (iVar3 == 0x16570bf)) {
    local_21 = 1;
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool ZmqCommsSS::processTxControlCmd(const ActionMessage& cmd,
                                     std::map<route_id, std::string>& routes,
                                     std::map<std::string, std::string>& connection_info)
{
    bool close_tx{false};

    switch (cmd.messageID) {
        case RECONNECT_TRANSMITTER:
            setTxStatus(ConnectionStatus::CONNECTED);
            break;
        case CONNECTION_INFORMATION:
            // Shouldn't reach here ideally
            if (serverMode) {
                connection_info.emplace(cmd.name(), cmd.payload.to_string());
            }
            break;
        case NEW_ROUTE:
            for (auto& mc : connection_info) {
                if (mc.second == cmd.payload.to_string()) {
                    routes.emplace(route_id(cmd.getExtraData()), mc.first);
                    break;
                }
            }
            break;
        case REMOVE_ROUTE:
            routes.erase(route_id(cmd.getExtraData()));
            break;
        case CLOSE_RECEIVER:
        case DISCONNECT:
            close_tx = true;
            break;
    }
    return close_tx;
}